

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::isNameValid(SelectionCompiler *this,string *name)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = 0;
  iVar3 = 0;
  for (uVar4 = 0; (ulong)uVar4 < name->_M_string_length; uVar4 = uVar4 + 1) {
    cVar1 = (name->_M_dataplus)._M_p[uVar4];
    if (cVar1 == '.') {
      iVar3 = iVar3 + 1;
    }
    else if (cVar1 == ']') {
      iVar2 = iVar2 + -1;
    }
    else if (cVar1 == '[') {
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2 == 0 && iVar3 < 4;
}

Assistant:

bool SelectionCompiler::isNameValid(const std::string& name) {
    int nbracket = 0;
    int ndot     = 0;
    for (unsigned int i = 0; i < name.size(); ++i) {
      switch (name[i]) {
      case '[':
        ++nbracket;
        break;
      case ']':
        --nbracket;
        break;
      case '.':
        ++ndot;
        break;
      }
    }

    // only allow 3 dots at most
    return (ndot <= 3 && nbracket == 0) ? true : false;
  }